

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_3.h
# Opt level: O2

void __thiscall PlayerMike_3::~PlayerMike_3(PlayerMike_3 *this)

{
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__PlayerMike_3_0010cbc8;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_predict).super__Vector_base<int,_std::allocator<int>_>);
  Player::~Player(&this->super_Player);
  return;
}

Assistant:

PlayerMike_3(const std::string& name) :
      Player(name),
      m_predict(27)
   {}